

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedLiteralEvaluator.cpp
# Opt level: O0

Literal * Kernel::FracLess<Kernel::RealConstantType>::normalizedLit
                    (bool polarity,TermList lhs,TermList rhs)

{
  int iVar1;
  TermList a1;
  Literal *pLVar2;
  TermList in_RDX;
  TermList in_RSI;
  Term *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  TermList in_stack_ffffffffffffffa8;
  
  if (normalizedLit(bool,Kernel::TermList,Kernel::TermList)::zero == '\0') {
    iVar1 = __cxa_guard_acquire(&normalizedLit(bool,Kernel::TermList,Kernel::TermList)::zero);
    if (iVar1 != 0) {
      in_stack_ffffffffffffffa8._content = (uint64_t)NumTraits<Kernel::RealConstantType>::zeroT();
      TermList::TermList((TermList *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff98);
      __cxa_guard_release(&normalizedLit(bool,Kernel::TermList,Kernel::TermList)::zero);
    }
  }
  a1 = NumTraits<Kernel::RealConstantType>::minus(in_stack_ffffffffffffffa8);
  NumTraits<Kernel::RealConstantType>::add(a1,in_RSI);
  pLVar2 = NumTraits<Kernel::RealConstantType>::less(SUB81(in_RSI._content >> 0x38,0),in_RDX,a1);
  return pLVar2;
}

Assistant:

static Literal* normalizedLit(bool polarity, TermList lhs, TermList rhs) {
    static auto zero = TermList(number::zeroT());
    return number::less(
              polarity,
              zero,
              number::add(rhs, number::minus(lhs)));
  }